

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool BeginPopupEx(char *str_id,ImGuiWindowFlags extra_flags)

{
  ImGuiWindowFlags *pIVar1;
  int iVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  ImGuiContext *g;
  char *fmt;
  char name [32];
  ImVec2 local_50;
  char local_48 [32];
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  uVar5 = ImGuiWindow::GetID(this,str_id,(char *)0x0);
  iVar2 = (GImGui->CurrentPopupStack).Size;
  if ((iVar2 < (GImGui->OpenPopupStack).Size) &&
     ((GImGui->OpenPopupStack).Data[iVar2].PopupId == uVar5)) {
    ImGui::PushStyleVar(2,0.0);
    if (((uint)extra_flags >> 0x1b & 1) == 0) {
      fmt = "##popup_%08x";
    }
    else {
      uVar5 = (pIVar3->CurrentPopupStack).Size;
      fmt = "##menu_%d";
    }
    ImFormatString(local_48,0x14,fmt,(ulong)uVar5);
    local_50.x = 0.0;
    local_50.y = 0.0;
    bVar4 = ImGui::Begin(local_48,(bool *)0x0,&local_50,-1.0,extra_flags | 0x2000147);
    if ((this->Flags & 0x80) == 0) {
      pIVar1 = &pIVar3->CurrentWindow->Flags;
      *pIVar1 = *pIVar1 & 0xffffff7f;
    }
    if (!bVar4) {
      ImGui::EndPopup();
    }
  }
  else {
    pIVar3 = GImGui;
    pIVar3->SetNextWindowSizeConstraint = false;
    pIVar3->SetNextWindowFocus = false;
    pIVar3->SetNextWindowPosCond = 0;
    pIVar3->SetNextWindowSizeCond = 0;
    pIVar3->SetNextWindowContentSizeCond = 0;
    pIVar3->SetNextWindowCollapsedCond = 0;
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool BeginPopupEx(const char* str_id, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(str_id);
    if (!IsPopupOpen(id))
    {
        ClearSetNextWindowData(); // We behave like Begin() and need to consume those values
        return false;
    }

    ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    ImGuiWindowFlags flags = extra_flags|ImGuiWindowFlags_Popup|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoMove|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_AlwaysAutoResize;

    char name[32];
    if (flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, 20, "##menu_%d", g.CurrentPopupStack.Size);    // Recycle windows based on depth
    else
        ImFormatString(name, 20, "##popup_%08x", id); // Not recycling, so we can close/open during the same frame

    bool is_open = ImGui::Begin(name, NULL, flags);
    if (!(window->Flags & ImGuiWindowFlags_ShowBorders))
        g.CurrentWindow->Flags &= ~ImGuiWindowFlags_ShowBorders;
    if (!is_open) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        ImGui::EndPopup();

    return is_open;
}